

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  thread *this;
  socklen_t __len;
  uint uVar5;
  char *pcVar6;
  sockaddr *local_90;
  int serverFd;
  char *local_80;
  Sock server;
  int *local_60;
  ThreadPtr Thread;
  ThreadPool threadsPool;
  
  if (argc < 6) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"usage: ");
    poVar4 = std::operator<<(poVar4,*argv);
    poVar4 = std::operator<<(poVar4," -h <ip> -p <port> -d <directory>");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    local_90 = (sockaddr *)0x0;
    iVar2 = 1;
    local_80 = (char *)0x0;
    pcVar6 = (char *)0x0;
    while( true ) {
      iVar1 = getopt(argc,argv,"h:p:d:D:");
      if (iVar1 == -1) break;
      if (iVar1 == 0x44) {
        iVar2 = atoi(_optarg);
      }
      else if (iVar1 == 100) {
        local_80 = _optarg;
      }
      else if (iVar1 == 0x70) {
        iVar1 = atoi(_optarg);
        local_90 = (sockaddr *)CONCAT44(extraout_var,iVar1);
      }
      else if (iVar1 == 0x68) {
        pcVar6 = _optarg;
      }
    }
    if (iVar2 != 0) {
      daemonize("/tmp",(char *)0x0);
    }
    threadsPool.threads.
    super__Vector_base<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>,_std::allocator<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    threadsPool.threads.
    super__Vector_base<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>,_std::allocator<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    threadsPool.threads.
    super__Vector_base<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>,_std::allocator<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __len = 0;
    Sock::Sock(&server,2,1,0,false);
    if (-1 < server.m_sid) {
      iVar2 = Sock::bind(&server,(int)pcVar6,local_90,__len);
      if (-1 < iVar2) {
        iVar2 = Sock::setNonblock(&server);
        if (iVar2 == 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"created server socket for: ");
          poVar4 = std::operator<<(poVar4,"host = ");
          poVar4 = std::operator<<(poVar4,pcVar6);
          poVar4 = std::operator<<(poVar4," port = ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)local_90);
          poVar4 = std::operator<<(poVar4," directory = ");
          poVar4 = std::operator<<(poVar4,local_80);
          std::endl<char,std::char_traits<char>>(poVar4);
          serverFd = server.m_sid;
          uVar5 = 0;
          while( true ) {
            uVar3 = std::thread::hardware_concurrency();
            if (uVar3 <= uVar5) break;
            this = (thread *)operator_new(8);
            local_60 = &serverFd;
            std::thread::thread<void(&)(void*),int*,void>(this,clientRead,&local_60);
            Thread._M_t.super___uniq_ptr_impl<std::thread,_void_(*const)(std::thread_*)>._M_t.
            super__Tuple_impl<0UL,_std::thread_*,_void_(*const)(std::thread_*)>.
            super__Tuple_impl<1UL,_void_(*const)(std::thread_*)>.
            super__Head_base<1UL,_void_(*const)(std::thread_*),_false>._M_head_impl =
                 (_Head_base<1UL,_void_(*const)(std::thread_*),_false>)
                 ThreadPool::anon_class_1_0_00000001::__invoke;
            Thread._M_t.super___uniq_ptr_impl<std::thread,_void_(*const)(std::thread_*)>._M_t.
            super__Tuple_impl<0UL,_std::thread_*,_void_(*const)(std::thread_*)>.
            super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = this;
            std::
            vector<std::unique_ptr<std::thread,void(*const)(std::thread*)>,std::allocator<std::unique_ptr<std::thread,void(*const)(std::thread*)>>>
            ::emplace_back<std::unique_ptr<std::thread,void(*const)(std::thread*)>>
                      ((vector<std::unique_ptr<std::thread,void(*const)(std::thread*)>,std::allocator<std::unique_ptr<std::thread,void(*const)(std::thread*)>>>
                        *)&threadsPool,&Thread);
            std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>::~unique_ptr(&Thread);
            uVar5 = uVar5 + 1;
          }
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cerr,
                                   "cannot set for server socket nonblock mode");
          std::endl<char,std::char_traits<char>>(poVar4);
        }
      }
    }
    Sock::~Sock(&server);
    std::
    vector<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>,_std::allocator<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>_>_>
    ::~vector(&threadsPool.threads);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
  if (argc < 6)
  {
    std::cerr << "usage: " << argv[0] << " -h <ip> -p <port> -d <directory>" << std::endl;
    return 0;
  }

  globalArgs_t globalArgs {nullptr, nullptr, 0, 1};
  static const char* optString = "h:p:d:D:";
  int opt = 0;

  opt = getopt( argc, argv, optString );
  while(opt != -1)
  {
    switch(opt)
    {
      case 'h':
        globalArgs.m_host = optarg;
        break;

      case 'p':
        globalArgs.m_port = atoi(optarg);
        break;

      case 'd':
        globalArgs.m_directory = optarg;
        break;

      case 'D':
      globalArgs.daemonize = atoi(optarg);
      break;

      default:
        break;
    }

    opt = getopt(argc, argv, optString);
  }

  if (globalArgs.daemonize)
    daemonize("/tmp");

  ThreadPool threadsPool;

  /* create a server socket */
  Sock server(AF_INET, SOCK_STREAM);
  if (!server.good())
    return 0;

  if (server.bind(globalArgs.m_host, globalArgs.m_port) < 0)
    return 0;

  if (server.setNonblock() != 0)
  {
    std::cerr << "cannot set for server socket nonblock mode" << std::endl;
    return 0;
  }

  std::cout << "created server socket for: "
            << "host = " << globalArgs.m_host
            << " port = " << globalArgs.m_port
            << " directory = " << globalArgs.m_directory
            << std::endl;

  int serverFd = server.fd();
  for (int i = 0; i < std::thread::hardware_concurrency(); ++i)
  {
    ThreadPool::ThreadPtr Thread(new std::thread(clientRead, &serverFd), ThreadPool::ThreadDeleter);
    threadsPool.threads.push_back(std::move(Thread));
  }

  return 0;
}